

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextBox.cpp
# Opt level: O3

bool __thiscall gui::TextBox::handleTextEntered(TextBox *this,uint32_t unicode)

{
  bool bVar1;
  size_t sVar2;
  String local_48;
  
  bVar1 = Widget::handleTextEntered(&this->super_Widget,unicode);
  if (((unicode != 0x7f) && (0x1f < unicode)) && (this->readOnly_ == false)) {
    if ((this->maxCharacters_ != 0) &&
       (sVar2 = sf::String::getSize(&this->boxString_), this->maxCharacters_ <= sVar2)) {
      return true;
    }
    sVar2 = this->caretPosition_;
    sf::String::String(&local_48,unicode);
    sf::String::insert(&this->boxString_,sVar2,&local_48);
    if ((anon_union_16_2_edb7204a_for_basic_string<unsigned_int,_std::char_traits<unsigned_int>,_std::allocator<unsigned_int>_>_11
         *)local_48.m_string._M_dataplus._M_p != &local_48.m_string.field_2) {
      operator_delete(local_48.m_string._M_dataplus._M_p);
    }
    updateCaretPosition(this,this->caretPosition_ + 1);
    Signal<gui::Widget_*,_const_sf::String_&>::emit
              (&this->onTextChange,&this->super_Widget,&this->boxString_);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool TextBox::handleTextEntered(uint32_t unicode) {
    bool eventConsumed = baseClass::handleTextEntered(unicode);
    if (!readOnly_ && unicode >= '\u0020' && unicode != '\u007f') {    // Printable character.
        if (maxCharacters_ == 0 || boxString_.getSize() < maxCharacters_) {
            boxString_.insert(caretPosition_, sf::String(unicode));
            updateCaretPosition(caretPosition_ + 1);
            onTextChange.emit(this, boxString_);
        }
        return true;
    }
    return eventConsumed;
}